

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O1

lys_module *
ly_ctx_load_sub_module
          (ly_ctx *ctx,lys_module *module,char *name,char *revision,int implement,
          unres_schema *unres)

{
  int iVar1;
  lys_module *plVar2;
  char *data;
  LY_ERR *pLVar3;
  long lVar4;
  lys_revision *plVar5;
  _func_void_void_ptr *local_48;
  _func_void_void_ptr *module_data_free;
  int local_38;
  LYS_INFORMAT local_34 [2];
  LYS_INFORMAT format;
  
  local_48 = (_func_void_void_ptr *)0x0;
  local_34[0] = LYS_IN_UNKNOWN;
  if (module == (lys_module *)0x0) {
    lVar4 = 8;
    module_data_free = (_func_void_void_ptr *)module;
    local_38 = implement;
    do {
      iVar1 = ly_strequal_(name,*(char **)((long)&__do_global_dtors_aux_fini_array_entry + lVar4));
      if ((iVar1 != 0) &&
         ((revision == (char *)0x0 ||
          (iVar1 = ly_strequal_(revision,*(char **)((long)&internal_modules[0].name + lVar4)),
          iVar1 != 0)))) {
        plVar2 = ly_ctx_get_module_by(ctx,name,8,revision,0);
        return plVar2;
      }
      lVar4 = lVar4 + 0x20;
    } while (lVar4 != 0xa8);
    module = (lys_module *)module_data_free;
    implement = local_38;
    if (revision != (char *)0x0) {
      if (5 < (ctx->models).used) {
        lVar4 = 5;
        do {
          plVar2 = (ctx->models).list[lVar4];
          iVar1 = ly_strequal_(name,plVar2->name);
          if (((iVar1 != 0) && (plVar2->rev_size != '\0')) &&
             (iVar1 = strcmp(revision,plVar2->rev->date), iVar1 == 0)) goto LAB_0011058a;
          lVar4 = lVar4 + 1;
        } while (lVar4 < (ctx->models).used);
      }
      plVar2 = (lys_module *)0x0;
LAB_0011058a:
      module = (lys_module *)module_data_free;
      implement = local_38;
      if (plVar2 != (lys_module *)0x0) {
        iVar1 = lys_set_implemented(plVar2);
        if (iVar1 != 0) {
          return (lys_module *)0x0;
        }
        return plVar2;
      }
    }
  }
  if (ctx->imp_clb != (ly_module_imp_clb)0x0) {
    module_data_free = (_func_void_void_ptr *)module;
    if (module == (lys_module *)0x0) {
      data = (*ctx->imp_clb)(name,revision,(char *)0x0,(char *)0x0,ctx->imp_clb_data,local_34,
                             &local_48);
    }
    else {
      plVar2 = lys_main_module(module);
      if (plVar2->rev_size == '\0') {
        plVar5 = (lys_revision *)0x0;
      }
      else {
        plVar5 = plVar2->rev;
      }
      data = (*ctx->imp_clb)(plVar2->name,plVar5->date,name,revision,ctx->imp_clb_data,local_34,
                             &local_48);
    }
    if (data == (char *)0x0) {
      if (module_data_free == (_func_void_void_ptr *)0x0 && revision == (char *)0x0) {
        plVar2 = ly_ctx_get_module_by(ctx,name,8,(char *)0x0,1);
        if ((plVar2 != (lys_module *)0x0) && ((plVar2->field_0x40 & 0x40) != 0)) {
          lys_set_enabled(plVar2);
        }
      }
      else {
        pLVar3 = ly_errno_location();
        *pLVar3 = LY_ESYS;
        plVar2 = (lys_module *)0x0;
        ly_log(LY_LLERR,"User module retrieval callback failed!");
      }
    }
    else {
      if (module_data_free == (_func_void_void_ptr *)0x0) {
        plVar2 = lys_parse_mem(ctx,data,local_34[0]);
      }
      else {
        plVar2 = (lys_module *)
                 lys_sub_parse_mem((lys_module *)module_data_free,data,local_34[0],unres);
      }
      if (local_48 != (_func_void_void_ptr *)0x0) {
        (*local_48)(data);
      }
    }
    return plVar2;
  }
  plVar2 = lyp_search_file(ctx,module,name,revision,implement,unres);
  return plVar2;
}

Assistant:

const struct lys_module *
ly_ctx_load_sub_module(struct ly_ctx *ctx, struct lys_module *module, const char *name, const char *revision,
                       int implement, struct unres_schema *unres)
{
    const struct lys_module *mod;
    char *module_data;
    int i;
    void (*module_data_free)(void *module_data) = NULL;
    LYS_INFORMAT format = LYS_IN_UNKNOWN;

    if (!module) {
        /* exception for internal modules */
        for (i = 0; i < INTERNAL_MODULES_COUNT; i++) {
            if (ly_strequal(name, internal_modules[i].name, 0)) {
                if (!revision || ly_strequal(revision, internal_modules[i].revision, 0)) {
                    /* return internal module */
                    return (struct lys_module *)ly_ctx_get_module(ctx, name, revision);
                }
            }
        }
        if (revision) {
            /* try to get the schema with the specific revision from the context,
             * include the disabled modules in the search to avoid their duplication,
             * they are enabled by the subsequent call to lys_set_implemented() */
            for (i = INTERNAL_MODULES_COUNT, mod = NULL; i < ctx->models.used; i++) {
                mod = ctx->models.list[i]; /* shortcut */
                if (ly_strequal(name, mod->name, 0) && mod->rev_size && !strcmp(revision, mod->rev[0].date)) {
                    break;
                }
                mod = NULL;
            }
            if (mod) {
                /* we get such a module, make it implemented */
                if (lys_set_implemented(mod)) {
                    /* the schema cannot be implemented */
                    mod = NULL;
                }
                return mod;
            }
        }
    }

    if (ctx->imp_clb) {
        if (module) {
            mod = lys_main_module(module);
            module_data = ctx->imp_clb(mod->name, (mod->rev_size ? mod->rev[0].date : NULL), name, revision, ctx->imp_clb_data, &format, &module_data_free);
        } else {
            module_data = ctx->imp_clb(name, revision, NULL, NULL, ctx->imp_clb_data, &format, &module_data_free);
        }
        if (!module_data) {
            if (module || revision) {
                /* we already know that the specified revision is not present in context, and we have no other
                 * option in case of submodules */
                LOGERR(LY_ESYS, "User module retrieval callback failed!");
                return NULL;
            } else {
                /* get the newest revision from the context */
                mod = ly_ctx_get_module_by(ctx, name, offsetof(struct lys_module, name), revision, 1);
                if (mod && mod->disabled) {
                    /* enable the required module */
                    lys_set_enabled(mod);
                }
                return mod;
            }
        }

        if (module) {
            mod = (struct lys_module *)lys_sub_parse_mem(module, module_data, format, unres);
        } else {
            mod = (struct lys_module *)lys_parse_mem(ctx, module_data, format);
        }

        if (module_data_free) {
            module_data_free(module_data);
        }
    } else {
        mod = lyp_search_file(ctx, module, name, revision, implement, unres);
    }

    return mod;
}